

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_linux.c
# Opt level: O3

ATimeUs aAppTime(void)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  long lVar3;
  timespec ts;
  timespec local_10;
  
  clock_gettime(1,&local_10);
  _Var2 = a__time_start.tv_sec;
  lVar3 = a__time_start.tv_nsec;
  if (a__time_start.tv_nsec == 0 && a__time_start.tv_sec == 0) {
    _Var2 = CONCAT44(local_10.tv_sec._4_4_,(int)local_10.tv_sec);
    a__time_start.tv_nsec = local_10.tv_nsec;
    a__time_start.tv_sec = _Var2;
    lVar3 = local_10.tv_nsec;
  }
  auVar1 = SEXT816(local_10.tv_nsec - lVar3) * SEXT816(0x20c49ba5e353f7cf);
  return ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) +
         ((int)local_10.tv_sec - (int)_Var2) * 1000000;
}

Assistant:

ATimeUs aAppTime(void) {
	struct timespec ts;
	clock_gettime(CLOCK_MONOTONIC, &ts);
	if (a__time_start.tv_sec == 0 && a__time_start.tv_nsec == 0)
		a__time_start = ts;
	return //
		(ts.tv_sec - a__time_start.tv_sec) * 1000000 + //
		(ts.tv_nsec - a__time_start.tv_nsec) / 1000;
}